

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool upb_Arena_IncRefFor(upb_Arena *a,void *owner)

{
  _Bool _Var1;
  uintptr_t uVar2;
  bool bVar3;
  upb_ArenaRoot uVar4;
  upb_ArenaInternal *local_48;
  uintptr_t uStack_40;
  upb_ArenaInternal *puStack_38;
  upb_ArenaRoot r;
  upb_ArenaInternal *ai;
  void *owner_local;
  upb_Arena *a_local;
  
  puStack_38 = upb_Arena_Internal(a);
  _Var1 = _upb_ArenaInternal_HasInitialBlock(puStack_38);
  if (_Var1) {
    a_local._7_1_ = false;
  }
  else {
    do {
      uVar4 = _upb_Arena_FindRoot(puStack_38);
      local_48 = uVar4.root;
      uStack_40 = uVar4.tagged_count;
      puStack_38 = local_48;
      uVar2 = _upb_Arena_RefCountFromTagged(uStack_40);
      uVar2 = _upb_Arena_TaggedFromRefcount(uVar2 + 1);
      LOCK();
      bVar3 = uStack_40 == local_48->parent_or_count;
      if (bVar3) {
        local_48->parent_or_count = uVar2;
      }
      UNLOCK();
    } while (!bVar3);
    a_local._7_1_ = true;
  }
  return a_local._7_1_;
}

Assistant:

bool upb_Arena_IncRefFor(const upb_Arena* a, const void* owner) {
  upb_ArenaInternal* ai = upb_Arena_Internal(a);
  if (_upb_ArenaInternal_HasInitialBlock(ai)) return false;
  upb_ArenaRoot r;
  r.root = ai;

retry:
  r = _upb_Arena_FindRoot(r.root);
  if (upb_Atomic_CompareExchangeWeak(
          &r.root->parent_or_count, &r.tagged_count,
          _upb_Arena_TaggedFromRefcount(
              _upb_Arena_RefCountFromTagged(r.tagged_count) + 1),
          // Relaxed order is safe on success, incrementing the refcount
          // need not perform any synchronization with the eventual free of the
          // arena - that's provided by decrements.
          memory_order_relaxed,
          // Relaxed order is safe on failure as r.tagged_count is immediately
          // overwritten by retrying the find root operation.
          memory_order_relaxed)) {
    // We incremented it successfully, so we are done.
    return true;
  }
  // We failed update due to parent switching on the arena.
  goto retry;
}